

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  char *pcVar1;
  char *__end;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  __end_00;
  double dVar2;
  byte bVar3;
  uint uVar4;
  long *plVar5;
  double dVar6;
  double dVar7;
  Value local_278;
  undefined4 local_250;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator<char> local_1d1;
  string local_1d0 [32];
  istringstream local_1b0 [8];
  IStringStream is;
  double local_30;
  double value;
  Value *decoded_local;
  Token *token_local;
  OurReader *this_local;
  
  local_30 = 0.0;
  pcVar1 = token->start_;
  __end = token->end_;
  value = (double)decoded;
  decoded_local = (Value *)token;
  token_local = (Token *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(local_1d0,pcVar1,__end,&local_1d1);
  std::__cxx11::istringstream::istringstream(local_1b0,local_1d0,_S_in);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  plVar5 = (long *)std::istream::operator>>((istream *)local_1b0,&local_30);
  bVar3 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
  dVar7 = local_30;
  if ((bVar3 & 1) != 0) {
    dVar6 = std::numeric_limits<double>::max();
    dVar2 = local_30;
    if ((dVar7 != dVar6) || (NAN(dVar7) || NAN(dVar6))) {
      dVar7 = std::numeric_limits<double>::lowest();
      if ((dVar2 != dVar7) || (NAN(dVar2) || NAN(dVar7))) {
        uVar4 = std::isinf(local_30);
        if ((uVar4 & 1) == 0) {
          pcVar1 = *(char **)&decoded_local->bits_;
          __end_00._M_head_impl =
               (decoded_local->comments_).ptr_._M_t.
               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
               .
               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               ._M_head_impl;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)&local_248,pcVar1,(char *)__end_00._M_head_impl,&local_249);
          std::operator+(&local_228,"\'",&local_248);
          std::operator+(&local_208,&local_228,"\' is not a number.");
          this_local._7_1_ = addError(this,&local_208,(Token *)decoded_local,(Location)0x0);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          goto LAB_0015af35;
        }
      }
      else {
        local_30 = std::numeric_limits<double>::infinity();
        local_30 = -local_30;
      }
    }
    else {
      local_30 = std::numeric_limits<double>::infinity();
    }
  }
  Value::Value(&local_278,local_30);
  Value::operator=((Value *)value,&local_278);
  Value::~Value(&local_278);
  this_local._7_1_ = 1;
LAB_0015af35:
  local_250 = 1;
  std::__cxx11::istringstream::~istringstream(local_1b0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  IStringStream is(String(token.start_, token.end_));
  if (!(is >> value)) {
    if (value == std::numeric_limits<double>::max())
      value = std::numeric_limits<double>::infinity();
    else if (value == std::numeric_limits<double>::lowest())
      value = -std::numeric_limits<double>::infinity();
    else if (!std::isinf(value))
      return addError(
          "'" + String(token.start_, token.end_) + "' is not a number.", token);
  }
  decoded = value;
  return true;
}